

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

optional<tinyusdz::value::texcoord2h> * __thiscall
tinyusdz::Attribute::get_value<tinyusdz::value::texcoord2h>
          (optional<tinyusdz::value::texcoord2h> *__return_storage_ptr__,Attribute *this)

{
  undefined8 in_RAX;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  primvar::PrimVar::get_value<tinyusdz::value::texcoord2h>
            ((optional<tinyusdz::value::texcoord2h> *)((long)&uStack_18 + 2),&this->_var);
  __return_storage_ptr__->has_value_ = uStack_18._2_1_;
  if (uStack_18._2_1_ == true) {
    __return_storage_ptr__->contained = uStack_18._4_4_;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return _var.get_value<T>();
  }